

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdInitializeCombinePubkey(void *handle,void **combine_handle)

{
  void *pvVar1;
  undefined8 *puVar2;
  CfdException *this;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  if (combine_handle != (void **)0x0) {
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"CombinePubkey","");
    pvVar1 = cfd::capi::AllocBuffer((string *)local_50,0x18);
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_);
    }
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    *(undefined8 **)((long)pvVar1 + 0x10) = puVar2;
    *combine_handle = pvVar1;
    return 0;
  }
  local_50._0_8_ = "cfdcapi_key.cpp";
  local_50._8_4_ = 0x527;
  local_50._16_8_ = "CfdInitializeCombinePubkey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"combine handle is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. combine handle is null.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeCombinePubkey(void* handle, void** combine_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiCombinePubkey* buffer = nullptr;
  try {
    cfd::Initialize();
    if (combine_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "combine handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. combine handle is null.");
    }

    buffer = static_cast<CfdCapiCombinePubkey*>(
        AllocBuffer(kPrefixCombinePubkey, sizeof(CfdCapiCombinePubkey)));
    buffer->pubkey_list = new std::vector<std::string>();
    *combine_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  if (buffer != nullptr) CfdFreeCombinePubkeyHandle(handle, buffer);
  return result;
}